

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O0

void QUnicodeTools::Tailored::thaiAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  char16_t *uc;
  QCharAttributes *in_stack_000000d8;
  qsizetype in_stack_000000e0;
  char16_t *in_stack_000000e8;
  
  thaiAssignAttributes(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  return;
}

Assistant:

static void thaiAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    assert(script == QChar::Script_Thai);
#if QT_CONFIG(library)
    const char16_t *uc = text + from;
    attributes += from;
    Q_UNUSED(script);
    thaiAssignAttributes(uc, len, attributes);
#else
    Q_UNUSED(script);
    Q_UNUSED(text);
    Q_UNUSED(from);
    Q_UNUSED(len);
    Q_UNUSED(attributes);
#endif
}